

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  double *pdVar2;
  bool bVar3;
  uint ssize;
  ulong uVar4;
  int i;
  ulong uVar5;
  value_type vVar6;
  
  uVar1 = (((fadexpr->fadexpr_).left_)->dx_).num_elts;
  ssize = (((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)ssize < (int)uVar1) {
    ssize = uVar1;
  }
  if (ssize != (this->dx_).num_elts) {
    Vector<double>::resize(&this->dx_,ssize);
  }
  if (ssize != 0) {
    pdVar2 = (this->dx_).ptr_to_data;
    bVar3 = FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>::
            hasFastAccess(&fadexpr->fadexpr_);
    uVar4 = 0;
    if (0 < (int)ssize) {
      uVar4 = (ulong)ssize;
    }
    uVar5 = 0;
    if (bVar3) {
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        vVar6 = FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>::
                fastAccessDx(&fadexpr->fadexpr_,(int)uVar5);
        pdVar2[uVar5] = vVar6;
      }
    }
    else {
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        vVar6 = FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>::
                dx(&fadexpr->fadexpr_,(int)uVar5);
        pdVar2[uVar5] = vVar6;
      }
    }
  }
  vVar6 = FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>::val
                    (&fadexpr->fadexpr_);
  this->val_ = vVar6;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}